

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

cmDependInformation * __thiscall
cmLBDepend::GetDependInformation(cmLBDepend *this,char *file,char *extraPath)

{
  char *pcVar1;
  iterator iVar2;
  mapped_type pcVar3;
  _Rb_tree_header *p_Var4;
  mapped_type *ppcVar5;
  string fullPath;
  string local_68;
  string local_48;
  
  FullPath_abi_cxx11_(&local_68,this,file,extraPath);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
          ::find(&(this->DependInformationMap)._M_t,&local_68);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (mapped_type)operator_new(0xa0);
    p_Var4 = &(pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header;
    (pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var4->_M_header;
    (pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var4->_M_header;
    (pcVar3->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar3->DependDone = false;
    pcVar3->SourceFile = (cmSourceFile *)0x0;
    (pcVar3->FullPath)._M_dataplus._M_p = (pointer)&(pcVar3->FullPath).field_2;
    (pcVar3->FullPath)._M_string_length = 0;
    (pcVar3->FullPath).field_2._M_local_buf[0] = '\0';
    (pcVar3->PathOnly)._M_dataplus._M_p = (pointer)&(pcVar3->PathOnly).field_2;
    (pcVar3->PathOnly)._M_string_length = 0;
    (pcVar3->PathOnly).field_2._M_local_buf[0] = '\0';
    (pcVar3->IncludeName)._M_dataplus._M_p = (pointer)&(pcVar3->IncludeName).field_2;
    (pcVar3->IncludeName)._M_string_length = 0;
    (pcVar3->IncludeName).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&pcVar3->FullPath);
    cmsys::SystemTools::GetFilenamePath(&local_48,&local_68);
    std::__cxx11::string::operator=((string *)&pcVar3->PathOnly,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (char *)(pcVar3->IncludeName)._M_string_length;
    strlen(file);
    std::__cxx11::string::_M_replace((ulong)&pcVar3->IncludeName,0,pcVar1,(ulong)file);
    ppcVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
              ::operator[](&this->DependInformationMap,&local_68);
    *ppcVar5 = pcVar3;
  }
  else {
    pcVar3 = *(mapped_type *)(iVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return pcVar3;
}

Assistant:

cmDependInformation* GetDependInformation(const char* file,
                                            const char* extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    DependInformationMapType::const_iterator result =
      this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second;
    }
    // Didn't find an instance.  Create a new one and save it.
    cmDependInformation* info = new cmDependInformation;
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = info;
    return info;
  }